

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::prim::print_prim_abi_cxx11_
          (string *__return_storage_ptr__,prim *this,Prim *prim,uint32_t indent)

{
  long lVar1;
  pointer pPVar2;
  pointer pTVar3;
  int iVar4;
  Prim *this_00;
  string *psVar5;
  byte bVar6;
  ostream *poVar7;
  long *plVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  PrimMeta *pPVar11;
  uint32_t uVar12;
  size_type *psVar13;
  _Base_ptr p_Var14;
  prim *ppVar15;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  prim *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar16;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long lVar17;
  prim *ppVar18;
  prim *extraout_RDX_06;
  prim *extraout_RDX_07;
  prim *extraout_RDX_08;
  uint uVar19;
  _Rb_tree_node_base *p_Var20;
  _Base_ptr p_Var21;
  pointer pPVar22;
  undefined1 in_R8B;
  ulong uVar23;
  _Base_ptr p_Var24;
  pprint *v;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  token nameTok;
  string s;
  stringstream ss;
  undefined1 local_2b0 [32];
  _Base_ptr local_290;
  size_t local_288;
  string local_280;
  uint local_25c;
  Prim *local_258;
  string local_250;
  uint local_22c;
  long *local_228;
  long local_220;
  long local_218 [2];
  pprint *local_208;
  uint local_1fc;
  string *local_1f8;
  prim *local_1f0;
  _Rb_tree_node_base *local_1e8;
  _Base_ptr *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  v = (pprint *)((ulong)prim & 0xffffffff);
  std::__cxx11::stringstream::stringstream(local_1b8);
  tinyusdz::value::pprint_value_abi_cxx11_
            (&local_1d8,(value *)(this + 0x298),(Value *)v,0,(bool)in_R8B);
  bVar25 = true;
  if ((2 < local_1d8._M_string_length) &&
     (local_1d8._M_dataplus._M_p[local_1d8._M_string_length - 2] == '{')) {
    bVar25 = local_1d8._M_dataplus._M_p[local_1d8._M_string_length - 1] != '\n';
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  ppVar18 = extraout_RDX;
  local_258 = (Prim *)this;
  local_208 = v;
  local_1f8 = __return_storage_ptr__;
  if (*(long *)(this + 0x348) != 0) {
    if (bVar25) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    ppVar18 = *(prim **)(this + 0x338);
    auVar27._8_8_ = ppVar18;
    auVar27._0_8_ = ppVar18;
    local_1f0 = this + 0x328;
    bVar25 = true;
    if (ppVar18 != local_1f0) {
      iVar4 = (int)prim;
      uVar19 = iVar4 + 1;
      local_25c = iVar4 + 2;
      local_22c = iVar4 + 3;
      local_1fc = uVar19;
      do {
        p_Var20 = auVar27._0_8_;
        pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)uVar19,auVar27._8_4_);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"variantSet ",0xb);
        local_228 = local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"\"","");
        local_2b0._0_8_ = local_2b0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b0,local_228,local_220 + (long)local_228);
        std::__cxx11::string::_M_append((char *)local_2b0,*(ulong *)(p_Var20 + 1));
        plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_2b0,(ulong)local_228);
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        psVar13 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_280.field_2._M_allocated_capacity = *psVar13;
          local_280.field_2._8_8_ = plVar8[3];
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar13;
          local_280._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_280._M_string_length = plVar8[1];
        *plVar8 = (long)psVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_280._M_dataplus._M_p,local_280._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = {\n",5);
        uVar16 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          uVar16 = extraout_RDX_01;
        }
        if (local_228 != local_218) {
          operator_delete(local_228,local_218[0] + 1);
          uVar16 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar16 = extraout_RDX_03;
        }
        uVar12 = (uint32_t)uVar16;
        auVar26._8_8_ = uVar16;
        auVar26._0_8_ = p_Var20[3]._M_right;
        local_1e0 = &p_Var20[3]._M_parent;
        local_1e8 = p_Var20;
        if (p_Var20[3]._M_right != (_Base_ptr)local_1e0) {
          do {
            p_Var20 = auVar26._0_8_;
            pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)local_25c,auVar26._8_4_);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
            local_228 = local_218;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"\"","");
            local_2b0._0_8_ = local_2b0 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2b0,local_228,local_220 + (long)local_228);
            std::__cxx11::string::_M_append((char *)local_2b0,*(ulong *)(p_Var20 + 1));
            plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_2b0,(ulong)local_228);
            uVar19 = local_22c;
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            psVar13 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_280.field_2._M_allocated_capacity = *psVar13;
              local_280.field_2._8_8_ = plVar8[3];
            }
            else {
              local_280.field_2._M_allocated_capacity = *psVar13;
              local_280._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_280._M_string_length = plVar8[1];
            *plVar8 = (long)psVar13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
            }
            uVar12 = (uint32_t)psVar13;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,local_280._M_dataplus._M_p,local_280._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_228 != local_218) {
              operator_delete(local_228,local_218[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            bVar25 = PrimMetas::authored((PrimMetas *)&p_Var20[3]._M_left);
            if (bVar25) {
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
              print_prim_metas_abi_cxx11_
                        ((string *)local_2b0,(tinyusdz *)&p_Var20[3]._M_left,
                         (PrimMeta *)(ulong)uVar19,uVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_2b0._0_8_,
                         CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
              uVar12 = extraout_EDX;
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
                uVar12 = extraout_EDX_00;
              }
              pprint::Indent_abi_cxx11_((string *)local_2b0,(pprint *)(ulong)local_25c,uVar12);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,(char *)local_2b0._0_8_,
                                  CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8," {\n",3);
            print_props((string *)local_2b0,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)(p_Var20 + 2),uVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_2b0._0_8_,CONCAT44(local_2b0._12_4_,local_2b0._8_4_))
            ;
            lVar17 = extraout_RDX_04;
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
              lVar17 = extraout_RDX_05;
            }
            bVar6 = *(byte *)&p_Var20[0x21]._M_parent;
            if (bVar6 == 0) {
              p_Var21 = p_Var20[0x23]._M_parent;
              p_Var14 = p_Var20[0x23]._M_left;
LAB_0015b671:
              uVar12 = (uint32_t)lVar17;
              if (p_Var14 != p_Var21) {
                lVar17 = 0;
                p_Var24 = (_Base_ptr)0x0;
                do {
                  print_prim_abi_cxx11_
                            ((string *)local_2b0,(prim *)((long)&p_Var21->_M_color + lVar17),
                             (Prim *)(ulong)uVar19,(uint32_t)p_Var14);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,(char *)local_2b0._0_8_,
                             CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
                  uVar12 = extraout_EDX_01;
                  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
                    uVar12 = extraout_EDX_02;
                  }
                  p_Var21 = p_Var20[0x23]._M_parent;
                  p_Var10 = (_Base_ptr)
                            (((long)p_Var20[0x23]._M_left - (long)p_Var21 >> 4) * 0x21cfb2b78c13521d
                            );
                  p_Var14 = (_Base_ptr)((long)&p_Var10[-1]._M_right + 7);
                  if (p_Var24 != p_Var14) {
                    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
                    p_Var21 = p_Var20[0x23]._M_parent;
                    p_Var10 = (_Base_ptr)
                              (((long)p_Var20[0x23]._M_left - (long)p_Var21 >> 4) *
                              0x21cfb2b78c13521d);
                    uVar12 = extraout_EDX_03;
                  }
                  p_Var24 = (_Base_ptr)((long)&p_Var24->_M_color + 1);
                  lVar17 = lVar17 + 0x350;
                } while (p_Var24 < p_Var10);
              }
            }
            else {
              p_Var21 = p_Var20[0x23]._M_parent;
              lVar17 = (long)p_Var20[0x21]._M_right - (long)p_Var20[0x21]._M_left >> 5;
              p_Var14 = p_Var20[0x23]._M_left;
              if (lVar17 != ((long)p_Var14 - (long)p_Var21 >> 4) * 0x21cfb2b78c13521d)
              goto LAB_0015b671;
              local_2b0._8_4_ = _S_red;
              local_2b0._16_8_ = (_Link_type)0x0;
              local_2b0._24_8_ = local_2b0 + 8;
              local_288 = 0;
              local_290 = (_Base_ptr)local_2b0._24_8_;
              if (p_Var14 != p_Var21) {
                lVar17 = 0;
                uVar23 = 0;
                do {
                  local_250._M_dataplus._M_p = (pointer)((long)&p_Var21->_M_color + lVar17);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                  ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                              *)local_2b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&p_Var21[0xd]._M_color + lVar17),(Prim **)&local_250);
                  uVar23 = uVar23 + 1;
                  p_Var21 = p_Var20[0x23]._M_parent;
                  lVar17 = lVar17 + 0x350;
                } while (uVar23 < (ulong)(((long)p_Var20[0x23]._M_left - (long)p_Var21 >> 4) *
                                         0x21cfb2b78c13521d));
                bVar6 = *(byte *)&p_Var20[0x21]._M_parent;
                uVar19 = local_22c;
              }
              if ((bVar6 & 1) == 0) {
LAB_0015bbd7:
                __assert_fail("has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                              ,0x584,
                              "const value_type &nonstd::optional_lite::optional<std::vector<tinyusdz::Token>>::value() const [T = std::vector<tinyusdz::Token>]"
                             );
              }
              lVar17 = 8;
              uVar23 = 0;
              while (p_Var14 = p_Var20[0x21]._M_left,
                    uVar23 < (ulong)((long)p_Var20[0x21]._M_right - (long)p_Var14 >> 5)) {
                local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                lVar1 = *(long *)((long)p_Var14 + lVar17 + -8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_250,lVar1,
                           *(long *)((long)&p_Var14->_M_color + lVar17) + lVar1);
                iVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                                *)local_2b0,&local_250);
                if (iVar9._M_node != (_Base_ptr)(local_2b0 + 8)) {
                  print_prim_abi_cxx11_
                            (&local_280,*(prim **)(iVar9._M_node + 2),(Prim *)(ulong)uVar19,
                             (uint32_t)(_Base_ptr)(local_2b0 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._M_dataplus._M_p != &local_280.field_2) {
                    operator_delete(local_280._M_dataplus._M_p,
                                    local_280.field_2._M_allocated_capacity + 1);
                  }
                  if (uVar23 != ((long)p_Var20[0x23]._M_left - (long)p_Var20[0x23]._M_parent >> 4) *
                                0x21cfb2b78c13521d - 1U) {
                    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_250._M_dataplus._M_p != &local_250.field_2) {
                  operator_delete(local_250._M_dataplus._M_p,
                                  local_250.field_2._M_allocated_capacity + 1);
                }
                uVar23 = uVar23 + 1;
                lVar17 = lVar17 + 0x20;
                if (*(char *)&p_Var20[0x21]._M_parent == '\0') goto LAB_0015bbd7;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                          *)local_2b0,(_Link_type)local_2b0._16_8_);
              uVar12 = extraout_EDX_04;
            }
            pprint::Indent_abi_cxx11_((string *)local_2b0,(pprint *)(ulong)local_25c,uVar12);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)local_2b0._0_8_,
                                CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
            }
            auVar26 = std::_Rb_tree_increment(p_Var20);
            uVar12 = auVar26._8_4_;
          } while ((_Base_ptr *)auVar26._0_8_ != local_1e0);
        }
        uVar19 = local_1fc;
        pprint::Indent_abi_cxx11_((string *)local_2b0,(pprint *)(ulong)local_1fc,uVar12);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_2b0._0_8_,
                            CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
        }
        auVar27 = std::_Rb_tree_increment(local_1e8);
        ppVar18 = auVar27._8_8_;
      } while (auVar27._0_8_ != local_1f0);
      bVar25 = true;
      this = (prim *)local_258;
    }
  }
  if ((((Prim *)this)->_children).
      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (((Prim *)this)->_children).
      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (bVar25) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    this_00 = local_258;
    pPVar11 = Prim::metas(local_258);
    ppVar15 = (prim *)((long)(pPVar11->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar11->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5);
    pPVar22 = (this_00->_children).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar2 = (this_00->_children).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ppVar18 = (prim *)(((long)pPVar2 - (long)pPVar22 >> 4) * 0x21cfb2b78c13521d);
    if (ppVar15 == ppVar18) {
      local_2b0._24_8_ = local_2b0 + 8;
      local_2b0._8_4_ = _S_red;
      local_2b0._16_8_ = (_Link_type)0x0;
      local_288 = 0;
      local_290 = (_Base_ptr)local_2b0._24_8_;
      if (pPVar2 != pPVar22) {
        lVar17 = 0;
        uVar23 = 0;
        do {
          local_250._M_dataplus._M_p =
               (pointer)((long)&(pPVar22->_abs_path)._prim_part._M_dataplus._M_p + lVar17);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                      *)local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pPVar22->_elementPath)._prim_part._M_dataplus._M_p + lVar17),
                     (Prim **)&local_250);
          uVar23 = uVar23 + 1;
          pPVar22 = (this_00->_children).
                    super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 0x350;
        } while (uVar23 < (ulong)(((long)(this_00->_children).
                                         super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar22
                                  >> 4) * 0x21cfb2b78c13521d));
      }
      pPVar11 = Prim::metas(this_00);
      if ((pPVar11->primChildren).
          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pPVar11->primChildren).
          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar4 = (int)local_208;
        lVar17 = 8;
        uVar23 = 0;
        do {
          if (uVar23 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          }
          pPVar11 = Prim::metas(local_258);
          pTVar3 = (pPVar11->primChildren).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar1 = *(long *)((long)pTVar3 + lVar17 + -8);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,lVar1,
                     *(long *)((long)&(pTVar3->str_)._M_dataplus._M_p + lVar17) + lVar1);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                          *)local_2b0,&local_250);
          if (iVar9._M_node != (_Base_ptr)(local_2b0 + 8)) {
            print_prim_abi_cxx11_
                      (&local_280,*(prim **)(iVar9._M_node + 2),(Prim *)(ulong)(iVar4 + 1),
                       (uint32_t)(_Base_ptr)(local_2b0 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          uVar23 = uVar23 + 1;
          pPVar11 = Prim::metas(local_258);
          lVar17 = lVar17 + 0x20;
        } while (uVar23 < (ulong)((long)(pPVar11->primChildren).
                                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pPVar11->primChildren).
                                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  *)local_2b0,(_Link_type)local_2b0._16_8_);
      ppVar18 = extraout_RDX_06;
    }
    else if (pPVar2 != pPVar22) {
      iVar4 = (int)local_208;
      lVar17 = 0;
      uVar23 = 0;
      do {
        if (uVar23 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          pPVar22 = (local_258->_children).
                    super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        print_prim_abi_cxx11_
                  ((string *)local_2b0,
                   (prim *)((long)&(pPVar22->_abs_path)._prim_part._M_dataplus._M_p + lVar17),
                   (Prim *)(ulong)(iVar4 + 1),(uint32_t)ppVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_2b0._0_8_,CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
        ppVar18 = extraout_RDX_07;
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
          ppVar18 = extraout_RDX_08;
        }
        uVar23 = uVar23 + 1;
        pPVar22 = (local_258->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar17 = lVar17 + 0x350;
      } while (uVar23 < (ulong)(((long)(local_258->_children).
                                       super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar22 >>
                                4) * 0x21cfb2b78c13521d));
    }
  }
  pprint::Indent_abi_cxx11_((string *)local_2b0,local_208,(uint32_t)ppVar18);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_2b0._0_8_,CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
  }
  psVar5 = local_1f8;
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

std::string print_prim(const Prim &prim, const uint32_t indent) {
  std::stringstream ss;

  // Currently, Prim's elementName is read from name variable in concrete Prim
  // class(e.g. Xform::name).
  // TODO: use prim.elementPath for elementName.
  std::string s = pprint_value(prim.data(), indent, /* closing_brace */ false);

  bool require_newline = true;

  // Check last 2 chars.
  // if it ends with '{\n', no properties are authored so do not emit blank line
  // before printing VariantSet or child Prims.
  if (s.size() > 2) {
    if ((s[s.size() - 2] == '{') && (s[s.size() - 1] == '\n')) {
      require_newline = false;
    }
  }

  ss << s;

  //
  // print variant
  //
  if (prim.variantSets().size()) {
    if (require_newline) {
      ss << "\n";
    }

    // need to add blank line after VariantSet stmt and before child Prims,
    // so set require_newline true
    require_newline = true;

    for (const auto &variantSet : prim.variantSets()) {
      ss << pprint::Indent(indent + 1) << "variantSet "
         << quote(variantSet.first) << " = {\n";

      for (const auto &variantItem : variantSet.second.variantSet) {
        ss << pprint::Indent(indent + 2) << quote(variantItem.first);

        const Variant &variant = variantItem.second;

        if (variant.metas().authored()) {
          ss << " (\n";
          ss << print_prim_metas(variant.metas(), indent + 3);
          ss << pprint::Indent(indent + 2) << ")";
        }

        ss << " {\n";

        ss << print_props(variant.properties(), indent + 3);

        if (variant.metas().variantChildren.has_value() &&
            (variant.metas().variantChildren.value().size() ==
             variant.primChildren().size())) {
          std::map<std::string, const Prim *> primNameTable;
          for (size_t i = 0; i < variant.primChildren().size(); i++) {
            primNameTable.emplace(variant.primChildren()[i].element_name(),
                                  &variant.primChildren()[i]);
          }

          for (size_t i = 0; i < variant.metas().variantChildren.value().size();
               i++) {
            value::token nameTok = variant.metas().variantChildren.value()[i];
            const auto it = primNameTable.find(nameTok.str());
            if (it != primNameTable.end()) {
              ss << print_prim(*(it->second), indent + 3);
              if (i != (variant.primChildren().size() - 1)) {
                ss << "\n";
              }
            } else {
              // TODO: Report warning?
            }
          }

        } else {
          for (size_t i = 0; i < variant.primChildren().size(); i++) {
            ss << print_prim(variant.primChildren()[i], indent + 3);
            if (i != (variant.primChildren().size() - 1)) {
              ss << "\n";
            }
          }
        }

        ss << pprint::Indent(indent + 2) << "}\n";
      }

      ss << pprint::Indent(indent + 1) << "}\n";
    }
  }

  //
  // primChildren
  //
  if (prim.children().size()) {
    if (require_newline) {
      ss << "\n";
      require_newline = false;
    }
    if (prim.metas().primChildren.size() == prim.children().size()) {
      // Use primChildren info to determine the order of the traversal.

      std::map<std::string, const Prim *> primNameTable;
      for (size_t i = 0; i < prim.children().size(); i++) {
        primNameTable.emplace(prim.children()[i].element_name(),
                              &prim.children()[i]);
      }

      for (size_t i = 0; i < prim.metas().primChildren.size(); i++) {
        if (i > 0) {
          ss << "\n";
        }
        value::token nameTok = prim.metas().primChildren[i];
        DCOUT(fmt::format("primChildren  {}/{} = {}", i,
                          prim.metas().primChildren.size(), nameTok.str()));
        const auto it = primNameTable.find(nameTok.str());
        if (it != primNameTable.end()) {
          ss << print_prim(*(it->second), indent + 1);
        } else {
          // TODO: Report warning?
        }
      }

    } else {
      for (size_t i = 0; i < prim.children().size(); i++) {
        if (i > 0) {
          ss << "\n";
        }
        ss << print_prim(prim.children()[i], indent + 1);
      }
    }
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}